

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_todo.cpp
# Opt level: O3

void __thiscall Am_Window_ToDo::Add(Am_Window_ToDo *this)

{
  Am_Window_ToDo **ppAVar1;
  
  if (((this->prev == (Am_Window_ToDo *)0x0) && (this->next == (Am_Window_ToDo *)0x0)) &&
     (ppAVar1 = &Window_ToDo_Head, Window_ToDo_Head != this)) {
    this->prev = Window_ToDo_Tail;
    if (Window_ToDo_Tail != (Am_Window_ToDo *)0x0) {
      ppAVar1 = &Window_ToDo_Tail->next;
    }
    *ppAVar1 = this;
    Window_ToDo_Tail = this;
    return;
  }
  return;
}

Assistant:

void
Am_Window_ToDo::Add()
{
  if (!prev && !next && (Window_ToDo_Head != this)) {
    prev = Window_ToDo_Tail;
    if (Window_ToDo_Tail)
      Window_ToDo_Tail->next = this;
    else
      Window_ToDo_Head = this;
    Window_ToDo_Tail = this;
  }
}